

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O1

void tcp_listener_doaccept(tcp_listener *l)

{
  nni_tcp_dialer **pfd;
  byte bVar1;
  byte bVar2;
  int iVar3;
  nng_err result;
  nni_aio *aio;
  int *piVar4;
  bool bVar5;
  nni_tcp_conn *local_40;
  nni_tcp_conn *c;
  
  c = (nni_tcp_conn *)l;
  aio = (nni_aio *)nni_list_first(&l->acceptq);
  if (aio != (nni_aio *)0x0) {
    pfd = &c->dialer;
    do {
      iVar3 = nni_posix_pfd_fd((nni_posix_pfd *)pfd);
      iVar3 = accept(iVar3,(sockaddr *)0x0,(socklen_t *)0x0);
      if (iVar3 < 0) {
        piVar4 = __errno_location();
        iVar3 = *piVar4;
        bVar5 = false;
        if (1 < iVar3 - 0x67U) {
          if (iVar3 != 0xb) {
            result = nni_plat_errno(iVar3);
            if (result == NNG_OK) {
              nni_panic("%s: %d: assert err: %s",
                        "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_tcplisten.c"
                        ,0x7b,"rv != 0");
            }
            nni_aio_list_remove(aio);
            goto LAB_0013af9b;
          }
          bVar5 = true;
          result = nni_posix_pfd_arm((nni_posix_pfd *)pfd,1);
          if (result != NNG_OK) goto LAB_0013af8e;
        }
      }
      else {
        result = nni_posix_tcp_alloc(&local_40,(nni_tcp_dialer *)0x0,iVar3);
        if (result == NNG_OK) {
          bVar1 = *(byte *)((long)&c[1].pfd.node.ln_prev + 3);
          bVar2 = *(byte *)((long)&c[1].pfd.node.ln_prev + 2);
          nni_aio_list_remove(aio);
          nni_posix_tcp_start(local_40,(uint)bVar2,(uint)bVar1);
          bVar5 = false;
          nni_aio_set_output(aio,0,local_40);
          nni_aio_finish(aio,NNG_OK,0);
        }
        else {
          close(iVar3);
LAB_0013af8e:
          nni_aio_list_remove(aio);
LAB_0013af9b:
          nni_aio_finish_error(aio,result);
          bVar5 = false;
        }
      }
    } while ((!bVar5) && (aio = (nni_aio *)nni_list_first(&l->acceptq), aio != (nni_aio *)0x0));
  }
  return;
}

Assistant:

static void
tcp_listener_doaccept(tcp_listener *l)
{
	nni_aio *aio;

	while ((aio = nni_list_first(&l->acceptq)) != NULL) {
		int           newfd;
		int           fd;
		int           rv;
		int           nd;
		int           ka;
		nni_tcp_conn *c;

		fd = nni_posix_pfd_fd(&l->pfd);

#ifdef NNG_USE_ACCEPT4
		newfd = accept4(fd, NULL, NULL, SOCK_CLOEXEC);
		if ((newfd < 0) && ((errno == ENOSYS) || (errno == ENOTSUP))) {
			newfd = accept(fd, NULL, NULL);
		}
#else
		newfd = accept(fd, NULL, NULL);
#endif
		if (newfd < 0) {
			switch (errno) {
			case EAGAIN:
#ifdef EWOULDBLOCK
#if EWOULDBLOCK != EAGAIN
			case EWOULDBLOCK:
#endif
#endif
				rv = nni_posix_pfd_arm(&l->pfd, NNI_POLL_IN);
				if (rv != 0) {
					nni_aio_list_remove(aio);
					nni_aio_finish_error(aio, rv);
					continue;
				}
				// Come back later...
				return;
			case ECONNABORTED:
			case ECONNRESET:
				// Eat them, they aren't interesting.
				continue;
			default:
				// Error this one, but keep moving to the next.
				rv = nni_plat_errno(errno);
				NNI_ASSERT(rv != 0);
				nni_aio_list_remove(aio);
				nni_aio_finish_error(aio, rv);
				continue;
			}
		}

		if ((rv = nni_posix_tcp_alloc(&c, NULL, newfd)) != 0) {
			close(newfd);
			nni_aio_list_remove(aio);
			nni_aio_finish_error(aio, rv);
			continue;
		}

		ka = l->keepalive ? 1 : 0;
		nd = l->nodelay ? 1 : 0;
		nni_aio_list_remove(aio);
		nni_posix_tcp_start(c, nd, ka);
		nni_aio_set_output(aio, 0, c);
		nni_aio_finish(aio, 0, 0);
	}
}